

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_set_vanchorf(fy_node *fyn,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  long lVar2;
  fy_document *fyd;
  fy_node *fyn_00;
  void *__format;
  int iVar3;
  size_t sVar4;
  char *__s;
  undefined8 uStack_90;
  char acStack_88 [7];
  bool local_81;
  char *local_80;
  fy_document *local_78;
  fy_node *local_70;
  char *local_68;
  char *local_60;
  char *_s;
  char *_buf;
  int _sizew;
  int _size;
  va_list _ap_orig;
  char *__fmt;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_node *fyn_local;
  
  __s = acStack_88;
  if ((fyn == (fy_node *)0x0) || (fmt == (char *)0x0)) {
    fyn_local._4_4_ = -1;
  }
  else {
    local_78 = fyn->fyd;
    _s = (char *)0x0;
    _ap_orig[0].overflow_arg_area = ap->reg_save_area;
    _sizew = ap->gp_offset;
    unique0x100000e1 = ap->fp_offset;
    _ap_orig[0]._0_8_ = ap->overflow_arg_area;
    uStack_90 = 0x124c8f;
    local_70 = fyn;
    _ap_orig[0].reg_save_area = fmt;
    _buf._4_4_ = vsnprintf((char *)0x0,0,fmt,&_sizew);
    __format = _ap_orig[0].reg_save_area;
    if (_buf._4_4_ != -1) {
      lVar2 = -((long)_buf._4_4_ + 0x10U & 0xfffffffffffffff0);
      __s = acStack_88 + lVar2;
      iVar3 = _buf._4_4_ + 1;
      _s = __s;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x124cd3;
      _buf._0_4_ = vsnprintf(__s,(long)iVar3,(char *)__format,ap);
      pcVar1 = _s;
      if (_buf._4_4_ != (int)_buf) {
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x124cff;
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x10b,
                      "int fy_node_set_vanchorf(struct fy_node *, const char *, struct __va_list_tag *)"
                     );
      }
      local_80 = _s;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x124d10;
      sVar4 = strlen(pcVar1);
      local_60 = local_80 + sVar4;
      while( true ) {
        local_81 = false;
        if (_s < local_60) {
          local_81 = local_60[-1] == '\n';
        }
        if (local_81 == false) break;
        pcVar1 = local_60 + -1;
        local_60 = local_60 + -1;
        *pcVar1 = '\0';
      }
    }
    pcVar1 = _s;
    fyn_00 = local_70;
    fyd = local_78;
    local_68 = _s;
    __s[-8] = -0x7c;
    __s[-7] = 'M';
    __s[-6] = '\x12';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    fyn_local._4_4_ = fy_document_set_anchor_internal(fyd,fyn_00,pcVar1,0xffffffffffffffff,1);
  }
  return fyn_local._4_4_;
}

Assistant:

int fy_node_set_vanchorf(struct fy_node *fyn, const char *fmt, va_list ap) {
    if (!fyn || !fmt)
        return -1;

    return fy_document_set_anchor_internal(fyn->fyd, fyn, alloca_vsprintf(fmt, ap), FY_NT, FYDSAF_COPY);
}